

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

void warning(char *fmt,...)

{
  FILE *__stream;
  char in_AL;
  int *piVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (noeol != 0) {
    fputc(10,_stdout);
  }
  fflush(_stdout);
  fwrite("unzip: ",7,1,_stderr);
  ap[0].gp_offset = 8;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_c8;
  vfprintf(_stderr,fmt,ap);
  __stream = _stderr;
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  fprintf(__stream,": %s\n",pcVar2);
  return;
}

Assistant:

static void
warning(const char *fmt, ...)
{
	va_list ap;

	if (noeol)
		fprintf(stdout, "\n");
	fflush(stdout);
	fprintf(stderr, "unzip: ");
	va_start(ap, fmt);
	vfprintf(stderr, fmt, ap);
	va_end(ap);
	fprintf(stderr, ": %s\n", strerror(errno));
}